

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ValueHolder VVar5;
  CommentInfo *pCVar6;
  ptrdiff_t pVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  ulong value;
  Value *this_00;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  cVar1 = *token->start_;
  uVar13 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar11 = (byte *)(token->start_ + (cVar1 == '-'));
  uVar12 = uVar13 / 10;
  bVar9 = false;
  value = 0;
  while (pbVar11 < token->end_) {
    bVar2 = *pbVar11;
    pbVar11 = pbVar11 + 1;
    if (((byte)(bVar2 - 0x3a) < 0xf6) ||
       ((uVar10 = (ulong)(bVar2 - 0x30), uVar12 <= value &&
        (((uVar12 < value || (pbVar11 != (byte *)token->end_)) || (uVar13 % 10 < uVar10)))))) {
      bVar9 = decodeDouble(this,token,decoded);
      bVar8 = false;
    }
    else {
      value = uVar10 + value * 10;
      bVar8 = true;
    }
    if (!bVar8) {
      return bVar9;
    }
  }
  if (cVar1 == '-') {
    value = -value;
    this_00 = &local_58;
  }
  else {
    if (0x7fffffff < value) {
      this_00 = &local_a8;
      Value::Value(this_00,value);
      goto LAB_0011f989;
    }
    this_00 = &local_80;
  }
  Value::Value(this_00,value);
LAB_0011f989:
  uVar3 = *(ushort *)&decoded->field_0x8;
  uVar4 = *(ushort *)&this_00->field_0x8;
  *(ushort *)&decoded->field_0x8 = uVar3 & 0xff00 | uVar4 & 0xff;
  *(ushort *)&this_00->field_0x8 = uVar4 & 0xff00 | uVar3 & 0xff;
  VVar5 = decoded->value_;
  decoded->value_ = this_00->value_;
  this_00->value_ = VVar5;
  *(ushort *)&decoded->field_0x8 = uVar3 & 0xfe00 | uVar4 & 0xff | uVar4 & 0x100;
  *(ushort *)&this_00->field_0x8 = uVar4 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100;
  pCVar6 = decoded->comments_;
  decoded->comments_ = this_00->comments_;
  this_00->comments_ = pCVar6;
  pVar7 = decoded->start_;
  decoded->start_ = this_00->start_;
  this_00->start_ = pVar7;
  pVar7 = decoded->limit_;
  decoded->limit_ = this_00->limit_;
  this_00->limit_ = pVar7;
  Value::~Value(this_00);
  return true;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}